

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertDoubleSpecial
               (UNITY_DOUBLE actual,char *msg,UNITY_UINT lineNumber,UNITY_FLOAT_TRAIT_T style)

{
  UNITY_FLOAT_TRAIT_T UVar1;
  uint uVar2;
  UNITY_FLOAT_TRAIT_T UVar3;
  long in_FS_OFFSET;
  bool bVar4;
  char *trait_names [4];
  char *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *local_38;
  char *pcStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = "NaN";
  pcStack_30 = "Determinate";
  local_48 = "Infinity";
  uStack_40 = 0x1095e0;
  uStack_3c = 0;
  if (Unity.CurrentTestIgnored != 0 || Unity.CurrentTestFailed != 0) goto LAB_00107bea;
  UVar3 = style & UNITY_FLOAT_IS_INF;
  if (UNITY_FLOAT_IS_DET < style) {
    UVar1 = UVar3 ^ UNITY_FLOAT_IS_INF;
    local_48 = "Invalid Float Trait";
    uVar2 = 0;
    goto LAB_00107be5;
  }
  uVar2 = style >> 1;
  switch(style) {
  default:
    bVar4 = actual < INFINITY;
    goto LAB_00107be2;
  case UNITY_FLOAT_IS_NOT_NEG_INF:
  case UNITY_FLOAT_IS_NEG_INF:
    bVar4 = -INFINITY < actual;
LAB_00107be2:
    UVar1 = (UNITY_FLOAT_TRAIT_T)!bVar4;
    break;
  case UNITY_FLOAT_IS_NOT_NAN:
  case UNITY_FLOAT_IS_NAN:
    UVar1 = (UNITY_FLOAT_TRAIT_T)NAN(actual);
    break;
  case UNITY_FLOAT_IS_NOT_DET:
  case UNITY_FLOAT_IS_DET:
    UVar1 = (UNITY_FLOAT_TRAIT_T)((ulong)ABS(actual) < 0x7ff0000000000000);
  }
LAB_00107be5:
  if (UVar1 != UVar3) {
    UnityTestResultsFailBegin(lineNumber);
    UnityPrint(" Expected ");
    if (UVar3 == UNITY_FLOAT_IS_NOT_INF) {
      UnityPrint("Not ");
    }
    UnityPrint((&local_48)[uVar2]);
    UnityPrint(" Was ");
    UnityPrintFloat(actual);
    UnityAddMsgIfSpecified(msg);
    Unity.CurrentTestFailed = 1;
    longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
  }
LAB_00107bea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnityAssertDoubleSpecial(const UNITY_DOUBLE actual,
                              const char* msg,
                              const UNITY_LINE_TYPE lineNumber,
                              const UNITY_FLOAT_TRAIT_T style)
{
    const char* trait_names[] = {UnityStrInf, UnityStrNegInf, UnityStrNaN, UnityStrDet};
    UNITY_INT should_be_trait = ((UNITY_INT)style & 1);
    UNITY_INT is_trait        = !should_be_trait;
    UNITY_INT trait_index     = (UNITY_INT)(style >> 1);

    RETURN_IF_FAIL_OR_IGNORE;

    switch (style)
    {
        case UNITY_FLOAT_IS_INF:
        case UNITY_FLOAT_IS_NOT_INF:
            is_trait = isinf(actual) && (actual > 0);
            break;
        case UNITY_FLOAT_IS_NEG_INF:
        case UNITY_FLOAT_IS_NOT_NEG_INF:
            is_trait = isinf(actual) && (actual < 0);
            break;

        case UNITY_FLOAT_IS_NAN:
        case UNITY_FLOAT_IS_NOT_NAN:
            is_trait = isnan(actual) ? 1 : 0;
            break;

        case UNITY_FLOAT_IS_DET: /* A determinate number is non infinite and not NaN. */
        case UNITY_FLOAT_IS_NOT_DET:
            is_trait = !isinf(actual) && !isnan(actual);
            break;

        default:
            trait_index = 0;
            trait_names[0] = UnityStrInvalidFloatTrait;
            break;
    }

    if (is_trait != should_be_trait)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrint(UnityStrExpected);
        if (!should_be_trait)
            UnityPrint(UnityStrNot);
        UnityPrint(trait_names[trait_index]);
        UnityPrint(UnityStrWas);
#ifndef UNITY_EXCLUDE_FLOAT_PRINT
        UnityPrintFloat(actual);
#else
        if (should_be_trait)
            UnityPrint(UnityStrNot);
        UnityPrint(trait_names[trait_index]);
#endif
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}